

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::
       createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_int>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedType<unsigned_int> min,WrappedType<unsigned_int> max)

{
  int iVar1;
  deUint32 dVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  WrappedType<unsigned_int> WVar6;
  int iVar7;
  long lVar8;
  deRandom rnd;
  ulong local_b0;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar7 = componentCount * 4;
  if (stride != 0) {
    iVar7 = stride;
  }
  iVar5 = iVar7 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  pcVar3 = (char *)operator_new__((long)(iVar5 * count));
  if (0 < count) {
    local_b0 = 0;
    do {
      if (0 < componentCount) {
        iVar1 = iVar5 * (int)local_b0;
        lVar8 = 0;
        do {
          WVar6.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_40);
            WVar6.m_value = dVar2 % (max.m_value - min.m_value) + min.m_value;
          }
          lVar4 = (long)(int)lVar8;
          *(uint *)(pcVar3 + lVar4 + iVar1) = WVar6.m_value;
          *(uint *)(pcVar3 + lVar4 + (long)iVar7 + (long)iVar1) = WVar6.m_value;
          *(uint *)(pcVar3 + lVar4 + (long)(iVar7 * 2) + (long)iVar1) = WVar6.m_value;
          *(uint *)(pcVar3 + lVar4 + (long)(iVar7 * 3) + (long)iVar1) = WVar6.m_value;
          *(uint *)(pcVar3 + lVar4 + (long)(iVar7 << 2) + (long)iVar1) = WVar6.m_value;
          *(uint *)(pcVar3 + lVar4 + (long)(iVar7 * 5) + (long)iVar1) = WVar6.m_value;
          lVar8 = lVar8 + 4;
        } while ((ulong)(uint)componentCount << 2 != lVar8);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != (uint)count);
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}